

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::ComputeLinkInterface
          (cmGeneratorTarget *this,string *config,cmOptionalLinkInterface *iface,
          cmGeneratorTarget *headTarget)

{
  cmGeneratorTarget *pcVar1;
  TargetType TVar2;
  PolicyStatus PVar3;
  cmLinkImplementation *pcVar4;
  cmLinkImplementationLibraries *pcVar5;
  char *pcVar6;
  pointer __x;
  pointer pcVar7;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar8;
  string propName;
  size_type __dnew;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  size_type __dnew_1;
  string local_c0;
  string *local_a0;
  string local_98;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  undefined4 local_50;
  undefined8 local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_40;
  
  if (iface->ExplicitLibraries == (char *)0x0) {
    PVar3 = cmPolicies::PolicyMap::Get(&this->PolicyMap,CMP0022);
    if ((PVar3 == WARN) ||
       (PVar3 = cmPolicies::PolicyMap::Get(&this->PolicyMap,CMP0022), PVar3 == OLD)) {
      pcVar5 = GetLinkImplementationLibrariesInternal(this,config,headTarget);
      (iface->super_cmLinkInterface).ImplementationIsInterface = true;
      std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::operator=
                (&(iface->super_cmLinkInterface).WrongConfigLibraries,&pcVar5->WrongConfigLibraries)
      ;
    }
  }
  else {
    TVar2 = this->Target->TargetTypeValue;
    if ((TVar2 < UNKNOWN_LIBRARY) && ((0x86U >> (TVar2 & 0x1f) & 1) != 0)) {
      local_70._M_allocated_capacity = (size_type)&aStack_40;
      local_70._8_8_ = 1;
      local_60._M_allocated_capacity = 0;
      local_60._8_8_ = 0;
      local_50 = 0x3f800000;
      local_48 = 0;
      aStack_40._M_allocated_capacity = 0;
      pcVar7 = (iface->super_cmLinkInterface).super_cmLinkInterfaceLibraries.Libraries.
               super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_a0 = config;
      if (pcVar7 != (iface->super_cmLinkInterface).super_cmLinkInterfaceLibraries.Libraries.
                    super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        do {
          local_c0._M_dataplus._M_p = (pointer)&local_70;
          std::
          _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                    ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)&local_70,pcVar7,&local_c0);
          pcVar7 = pcVar7 + 1;
        } while (pcVar7 != (iface->super_cmLinkInterface).super_cmLinkInterfaceLibraries.Libraries.
                           super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                           super__Vector_impl_data._M_finish);
        TVar2 = this->Target->TargetTypeValue;
      }
      if (TVar2 != INTERFACE_LIBRARY) {
        pcVar4 = GetLinkImplementation(this,local_a0);
        __x = (pcVar4->super_cmLinkImplementationLibraries).Libraries.
              super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
              super__Vector_impl_data._M_start;
        if (__x != (pcVar4->super_cmLinkImplementationLibraries).Libraries.
                   super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                   super__Vector_impl_data._M_finish) {
          local_78 = &(iface->super_cmLinkInterface).SharedDeps;
          do {
            local_c0._M_dataplus._M_p = (pointer)&local_70;
            pVar8 = std::
                    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    ::
                    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                *)&local_70,__x,&local_c0);
            if (((((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
                (pcVar1 = (__x->super_cmLinkItem).Target, pcVar1 != (cmGeneratorTarget *)0x0)) &&
               (pcVar1->Target->TargetTypeValue == SHARED_LIBRARY)) {
              std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::push_back
                        (local_78,&__x->super_cmLinkItem);
            }
            __x = __x + 1;
          } while (__x != (pcVar4->super_cmLinkImplementationLibraries).Libraries.
                          super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>.
                          _M_impl.super__Vector_impl_data._M_finish);
        }
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)&local_70);
      config = local_a0;
    }
  }
  if ((this->Target->TargetTypeValue == STATIC_LIBRARY) &&
     (pcVar4 = GetLinkImplementation(this,config), pcVar4 != (cmLinkImplementation *)0x0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&(iface->super_cmLinkInterface).Languages,&pcVar4->Languages);
  }
  if (this->Target->TargetTypeValue != STATIC_LIBRARY) {
    return;
  }
  local_60._M_allocated_capacity._0_2_ = 0x5f;
  local_70._8_8_ = 1;
  local_70._M_allocated_capacity = (size_type)&local_60;
  if (config->_M_string_length == 0) {
    std::__cxx11::string::append(local_70._M_local_buf);
  }
  else {
    cmsys::SystemTools::UpperCase(&local_c0,config);
    std::__cxx11::string::_M_append(local_70._M_local_buf,(ulong)local_c0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
  }
  local_98._M_dataplus._M_p = (char *)0x1b;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_c0,(ulong)&local_98);
  local_c0.field_2._M_allocated_capacity = (size_type)local_98._M_dataplus._M_p;
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p + 0xb) = 'A';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p + 0xc) = 'C';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p + 0xd) = 'E';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p + 0xe) = '_';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p + 0xf) = 'M';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p + 0x10) = 'U';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p + 0x11) = 'L';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p + 0x12) = 'T';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p + 0x13) = 'I';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p + 0x14) = 'P';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p + 0x15) = 'L';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p + 0x16) = 'I';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p + 0x17) = 'C';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p + 0x18) = 'I';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p + 0x19) = 'T';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p + 0x1a) = 'Y';
  *(undefined8 *)local_c0._M_dataplus._M_p = 0x544e495f4b4e494c;
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p + 8) = 'E';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p + 9) = 'R';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p + 10) = 'F';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p + 0xb) = 'A';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p + 0xc) = 'C';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p + 0xd) = 'E';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p + 0xe) = '_';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p + 0xf) = 'M';
  local_c0._M_string_length = (size_type)local_98._M_dataplus._M_p;
  local_c0._M_dataplus._M_p[(long)local_98._M_dataplus._M_p] = '\0';
  std::__cxx11::string::_M_append((char *)&local_c0,local_70._M_allocated_capacity);
  pcVar6 = GetProperty(this,&local_c0);
  if (pcVar6 == (char *)0x0) {
    aStack_40._8_8_ = 0x1b;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    local_98._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(long)&aStack_40 + 8);
    local_98.field_2._M_allocated_capacity = aStack_40._8_8_;
    builtin_strncpy(local_98._M_dataplus._M_p,"LINK_INTERFACE_MULTIPLICITY",0x1b);
    local_98._M_string_length = aStack_40._8_8_;
    local_98._M_dataplus._M_p[aStack_40._8_8_] = '\0';
    pcVar6 = GetProperty(this,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (pcVar6 == (char *)0x0) goto LAB_0039dac9;
  }
  __isoc99_sscanf(pcVar6,"%u",&(iface->super_cmLinkInterface).Multiplicity);
LAB_0039dac9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,(ulong)(local_c0.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_allocated_capacity != &local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,local_60._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGeneratorTarget::ComputeLinkInterface(
  const std::string& config, cmOptionalLinkInterface& iface,
  cmGeneratorTarget const* headTarget) const
{
  if (iface.ExplicitLibraries) {
    if (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->GetType() == cmStateEnums::STATIC_LIBRARY ||
        this->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      // Shared libraries may have runtime implementation dependencies
      // on other shared libraries that are not in the interface.
      CM_UNORDERED_SET<std::string> emitted;
      for (std::vector<cmLinkItem>::const_iterator li =
             iface.Libraries.begin();
           li != iface.Libraries.end(); ++li) {
        emitted.insert(*li);
      }
      if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY) {
        cmLinkImplementation const* impl = this->GetLinkImplementation(config);
        for (std::vector<cmLinkImplItem>::const_iterator li =
               impl->Libraries.begin();
             li != impl->Libraries.end(); ++li) {
          if (emitted.insert(*li).second) {
            if (li->Target) {
              // This is a runtime dependency on another shared library.
              if (li->Target->GetType() == cmStateEnums::SHARED_LIBRARY) {
                iface.SharedDeps.push_back(*li);
              }
            } else {
              // TODO: Recognize shared library file names.  Perhaps this
              // should be moved to cmComputeLinkInformation, but that creates
              // a chicken-and-egg problem since this list is needed for its
              // construction.
            }
          }
        }
      }
    }
  } else if (this->GetPolicyStatusCMP0022() == cmPolicies::WARN ||
             this->GetPolicyStatusCMP0022() == cmPolicies::OLD) {
    // The link implementation is the default link interface.
    cmLinkImplementationLibraries const* impl =
      this->GetLinkImplementationLibrariesInternal(config, headTarget);
    iface.ImplementationIsInterface = true;
    iface.WrongConfigLibraries = impl->WrongConfigLibraries;
  }

  if (this->LinkLanguagePropagatesToDependents()) {
    // Targets using this archive need its language runtime libraries.
    if (cmLinkImplementation const* impl =
          this->GetLinkImplementation(config)) {
      iface.Languages = impl->Languages;
    }
  }

  if (this->GetType() == cmStateEnums::STATIC_LIBRARY) {
    // Construct the property name suffix for this configuration.
    std::string suffix = "_";
    if (!config.empty()) {
      suffix += cmSystemTools::UpperCase(config);
    } else {
      suffix += "NOCONFIG";
    }

    // How many repetitions are needed if this library has cyclic
    // dependencies?
    std::string propName = "LINK_INTERFACE_MULTIPLICITY";
    propName += suffix;
    if (const char* config_reps = this->GetProperty(propName)) {
      sscanf(config_reps, "%u", &iface.Multiplicity);
    } else if (const char* reps =
                 this->GetProperty("LINK_INTERFACE_MULTIPLICITY")) {
      sscanf(reps, "%u", &iface.Multiplicity);
    }
  }
}